

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilderPrivate * __thiscall
QMetaMethodBuilderPrivate::operator=
          (QMetaMethodBuilderPrivate *this,QMetaMethodBuilderPrivate *param_2)

{
  QList<QByteArray> *in_RSI;
  QMetaMethodBuilderPrivate *in_RDI;
  
  QByteArray::operator=((QByteArray *)in_RSI,&in_RDI->signature);
  QByteArray::operator=((QByteArray *)in_RSI,&in_RDI->signature);
  QList<QByteArray>::operator=(in_RSI,(QList<QByteArray> *)in_RDI);
  QByteArray::operator=((QByteArray *)in_RSI,&in_RDI->signature);
  *(Data **)&in_RDI->attributes = in_RSI[4].d.d;
  return in_RDI;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }